

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

bool __thiscall crnlib::dxt_image::unpack(dxt_image *this,image_u8 *img)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint block_y;
  bool bVar5;
  bool bVar6;
  uint i;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uchar *puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint block_x;
  ulong uVar15;
  uint uVar16;
  color_quad_u8 pixels [16];
  int local_a4;
  ulong local_a0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_7c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_78 [18];
  
  uVar1 = this->m_total_elements;
  if (uVar1 != 0) {
    local_7c.m_u32 = 0xff000000;
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (img,this->m_width,this->m_height,0xffffffff,
               (color_quad<unsigned_char,_int> *)&local_7c.field_0);
    lVar7 = 0;
    do {
      local_78[lVar7].m_u32 = 0xff000000;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    if (this->m_blocks_y != 0) {
      bVar5 = true;
      bVar6 = true;
      local_a4 = 0;
      local_a0 = 0;
      do {
        if (this->m_blocks_x != 0) {
          uVar2 = img->m_height;
          block_y = (uint)local_a0;
          uVar16 = uVar2 + block_y * -4;
          if (3 < uVar16) {
            uVar16 = 4;
          }
          iVar14 = 0;
          uVar15 = 0;
          bVar6 = bVar5;
          do {
            block_x = (uint)uVar15;
            bVar5 = get_block_pixels(this,block_x,block_y,(color_quad_u8 *)&local_78[0].field_0);
            if (!bVar5) {
              bVar6 = false;
            }
            if (uVar2 != block_y * 4) {
              uVar3 = img->m_width;
              uVar8 = uVar3 + block_x * -4;
              uVar9 = (ulong)uVar8;
              if (3 < uVar8) {
                uVar9 = 4;
              }
              puVar10 = &local_78[0].field_0.a;
              uVar12 = 0;
              iVar11 = local_a4;
              do {
                if (uVar3 != block_x * 4) {
                  uVar13 = 0;
                  do {
                    pcVar4 = img->m_pPixels;
                    uVar8 = img->m_pitch * iVar11 + iVar14 + (int)uVar13;
                    pcVar4[uVar8].field_0.field_0.r = puVar10[uVar13 * 4 + -3];
                    pcVar4[uVar8].field_0.field_0.g = puVar10[uVar13 * 4 + -2];
                    pcVar4[uVar8].field_0.field_0.b = puVar10[uVar13 * 4 + -1];
                    pcVar4[uVar8].field_0.field_0.a = puVar10[uVar13 * 4];
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < uVar9);
                }
                uVar12 = uVar12 + 1;
                iVar11 = iVar11 + 1;
                puVar10 = puVar10 + 0x10;
              } while (uVar12 < uVar16);
            }
            uVar15 = uVar15 + 1;
            iVar14 = iVar14 + 4;
            bVar5 = bVar6;
          } while (uVar15 < this->m_blocks_x);
        }
        local_a0 = local_a0 + 1;
        local_a4 = local_a4 + 4;
      } while (local_a0 < this->m_blocks_y);
      if (!bVar6) {
        console::error("dxt_image::unpack: One or more invalid blocks encountered!");
      }
    }
    img->m_comp_flags = 8;
    if (this->m_num_elements_per_block != 0) {
      uVar15 = 0;
      do {
        uVar16 = 1 << (this->m_element_component_index[uVar15] & 0x1fU);
        if (this->m_element_component_index[uVar15] < '\0') {
          uVar16 = 7;
        }
        img->m_comp_flags = img->m_comp_flags | uVar16;
        uVar15 = uVar15 + 1;
      } while (uVar15 < this->m_num_elements_per_block);
    }
    bVar6 = get_dxt_format_has_alpha(this->m_format);
    img->m_comp_flags = (img->m_comp_flags & 0xfffffff7) + (uint)bVar6 * 8;
  }
  return uVar1 != 0;
}

Assistant:

bool dxt_image::unpack(image_u8& img) const {
  if (!m_total_elements)
    return false;

  img.resize(m_width, m_height);

  color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];
  for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
    pixels[i].set(0, 0, 0, 255);

  bool all_blocks_valid = true;
  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;
    const uint limit_y = math::minimum<uint>(cDXTBlockSize, img.get_height() - pixel_ofs_y);

    for (uint block_x = 0; block_x < m_blocks_x; block_x++) {
      if (!get_block_pixels(block_x, block_y, pixels))
        all_blocks_valid = false;

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      const uint limit_x = math::minimum<uint>(cDXTBlockSize, img.get_width() - pixel_ofs_x);

      for (uint y = 0; y < limit_y; y++) {
        const uint iy = pixel_ofs_y + y;

        for (uint x = 0; x < limit_x; x++) {
          const uint ix = pixel_ofs_x + x;

          img(ix, iy) = pixels[x + (y << cDXTBlockShift)];
        }
      }
    }
  }

  if (!all_blocks_valid)
    console::error("dxt_image::unpack: One or more invalid blocks encountered!");

  img.reset_comp_flags();
  img.set_component_valid(0, false);
  img.set_component_valid(1, false);
  img.set_component_valid(2, false);
  for (uint i = 0; i < m_num_elements_per_block; i++) {
    if (m_element_component_index[i] < 0) {
      img.set_component_valid(0, true);
      img.set_component_valid(1, true);
      img.set_component_valid(2, true);
    } else
      img.set_component_valid(m_element_component_index[i], true);
  }

  img.set_component_valid(3, get_dxt_format_has_alpha(m_format));

  return true;
}